

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

stsentry * Curl_hsts(hsts *h,char *hostname,_Bool subdomain)

{
  int iVar1;
  time_t tVar2;
  Curl_llist_element *max;
  size_t offs;
  size_t ntail;
  stsentry *sts;
  Curl_llist_element *n;
  Curl_llist_element *e;
  size_t hlen;
  time_t now;
  char buffer [257];
  _Bool subdomain_local;
  char *hostname_local;
  hsts *h_local;
  
  if (h == (hsts *)0x0) {
LAB_00a616d0:
    h_local = (hsts *)0x0;
  }
  else {
    buffer[0xff] = subdomain;
    unique0x100001a4 = (time_t *)hostname;
    tVar2 = time((time_t *)0x0);
    e = (Curl_llist_element *)strlen((char *)stack0xffffffffffffffe0);
    if ((e < (Curl_llist_element *)0x101) && (e != (Curl_llist_element *)0x0)) {
      memcpy(&now,stack0xffffffffffffffe0,(size_t)e);
      if (*(char *)((long)stack0xffffffffffffffe0 + (long)((long)&e[-1].next + 7)) == '.') {
        e = (Curl_llist_element *)((long)&e[-1].next + 7);
      }
      *(undefined1 *)((long)&now + (long)e) = 0;
      unique0x00004880 = &now;
      n = (h->list).head;
      do {
        while( true ) {
          if (n == (Curl_llist_element *)0x0) goto LAB_00a616d0;
          h_local = (hsts *)n->ptr;
          n = n->next;
          if (tVar2 < ((stsentry *)h_local)->expires) break;
          Curl_llist_remove(&h->list,(Curl_llist_element *)h_local,(void *)0x0);
          hsts_free((stsentry *)h_local);
        }
      } while ((((((buffer[0xff] & 1U) == 0) ||
                 ((((stsentry *)h_local)->includeSubDomains & 1U) == 0)) ||
                (max = (Curl_llist_element *)strlen(((stsentry *)h_local)->host), e <= max)) ||
               ((*(char *)((long)stack0xffffffffffffffe0 + ((long)e - (long)max) + -1) != '.' ||
                (iVar1 = curl_strnequal((char *)((long)stack0xffffffffffffffe0 +
                                                ((long)e - (long)max)),((stsentry *)h_local)->host,
                                        (size_t)max), iVar1 == 0)))) &&
              (iVar1 = curl_strequal((char *)stack0xffffffffffffffe0,((stsentry *)h_local)->host),
              iVar1 == 0));
    }
    else {
      h_local = (hsts *)0x0;
    }
  }
  return (stsentry *)h_local;
}

Assistant:

struct stsentry *Curl_hsts(struct hsts *h, const char *hostname,
                           bool subdomain)
{
  if(h) {
    char buffer[MAX_HSTS_HOSTLEN + 1];
    time_t now = time(NULL);
    size_t hlen = strlen(hostname);
    struct Curl_llist_element *e;
    struct Curl_llist_element *n;

    if((hlen > MAX_HSTS_HOSTLEN) || !hlen)
      return NULL;
    memcpy(buffer, hostname, hlen);
    if(hostname[hlen-1] == '.')
      /* remove the trailing dot */
      --hlen;
    buffer[hlen] = 0;
    hostname = buffer;

    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      n = e->next;
      if(sts->expires <= now) {
        /* remove expired entries */
        Curl_llist_remove(&h->list, &sts->node, NULL);
        hsts_free(sts);
        continue;
      }
      if(subdomain && sts->includeSubDomains) {
        size_t ntail = strlen(sts->host);
        if(ntail < hlen) {
          size_t offs = hlen - ntail;
          if((hostname[offs-1] == '.') &&
             strncasecompare(&hostname[offs], sts->host, ntail))
            return sts;
        }
      }
      if(strcasecompare(hostname, sts->host))
        return sts;
    }
  }
  return NULL; /* no match */
}